

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.c
# Opt level: O0

int hashtable_del(hashtable_t *hashtable,char *key)

{
  uint32_t uVar1;
  int iVar2;
  size_t length;
  size_t hash;
  char *key_local;
  hashtable_t *hashtable_local;
  
  length = strlen(key);
  uVar1 = hashlittle(key,length,hashtable_seed);
  iVar2 = hashtable_do_del(hashtable,key,(ulong)uVar1);
  return iVar2;
}

Assistant:

int hashtable_del(hashtable_t *hashtable, const char *key)
{
    size_t hash = hash_str(key);
    return hashtable_do_del(hashtable, key, hash);
}